

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O1

openmode __thiscall
cppforth::Forth::GetFileAccessMode(Forth *this,Cell handler,string *function,errorCodes ec)

{
  pointer pFVar1;
  bool bVar2;
  openmode in_EAX;
  undefined8 uVar3;
  pointer pFVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pFVar4 = (this->OpenFiles).
           super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->OpenFiles).
           super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar2 = pFVar4 == pFVar1;
    if (bVar2) {
LAB_00126acf:
      if (!bVar2) {
        return in_EAX;
      }
      std::operator+(&local_50,function,": wrong file handler access");
      throwMessage(this,&local_50,ec);
      std::__cxx11::string::~string((string *)&local_50);
      uVar3 = __cxa_rethrow();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar3);
    }
    if ((pFVar4->FILE == handler) &&
       (in_EAX = std::__basic_file<char>::is_open(), (char)in_EAX != '\0')) {
      in_EAX = pFVar4->fileAccessMode;
      goto LAB_00126acf;
    }
    pFVar4 = pFVar4 + 1;
  } while( true );
}

Assistant:

std::ios_base::openmode GetFileAccessMode(Cell handler, const std::string& function, errorCodes ec = errorAbort) {
	for (auto it = OpenFiles.begin(); it != OpenFiles.end(); ++it) {
		if ((*it).FILE == handler && (*it).fileObject->is_open()) {
			return (*it).fileAccessMode;
		}
	}
	throwMessage(function + ": wrong file handler access", ec);
	throw;
}